

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

float __thiscall comparer_context::cmp<float>(comparer_context *this,string *name)

{
  ostream *poVar1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  float local_24;
  float local_20;
  float t;
  float e;
  float a;
  string *name_local;
  comparer_context *this_local;
  
  _e = name;
  name_local = (string *)this;
  read<float>(this,&t,&local_20);
  local_24 = ABS(t - local_20);
  if (0.1 < local_24) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar1 = std::operator<<(local_1a0,"Expected ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    poVar1 = std::operator<<(poVar1,", but actual is ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t);
    poVar1 = std::operator<<(poVar1," (delta is ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_24);
    std::operator<<(poVar1,")");
    std::__cxx11::stringstream::str();
    failure(this,&local_1e0,_e);
  }
  return t;
}

Assistant:

float comparer_context :: cmp<float>(const std::string& name)
{
    float a,e,t;
    read(a,e);

    if((t=fabs(a-e)) > MY_FLT_EPSILON) {
        std::stringstream ss;
        failure((ss<< "Expected " << e << ", but actual is "
            << a << " (delta is " << t << ")", ss.str()),name);
    }
    return a;
}